

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# creadhb.c
# Opt level: O2

void creadhb(FILE *fp,int *nrow,int *ncol,int_t *nonz,singlecomplex **nzval,int_t **rowind,
            int_t **colptr)

{
  int *piVar1;
  int_t *addr;
  int_t *addr_00;
  int iVar2;
  int iVar3;
  int_t *addr_01;
  int_t *addr_02;
  ulong uVar4;
  ulong uVar5;
  int_t *piVar6;
  singlecomplex *psVar7;
  long lVar8;
  singlecomplex *psVar9;
  FILE *pFVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int_t *piVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  bool bVar19;
  double dVar20;
  int tmp;
  singlecomplex **local_220;
  int_t **local_218;
  singlecomplex *local_210;
  FILE *local_208;
  int_t *local_200;
  int_t *local_1f8;
  void *local_1f0;
  int valsize;
  int valnum;
  int rowsize;
  int rownum;
  int colsize;
  int colnum;
  char type [4];
  char buf [100];
  char msg [256];
  
  local_220 = nzval;
  local_218 = rowind;
  local_208 = (FILE *)fp;
  fgets(buf,100,(FILE *)fp);
  fputs(buf,_stdout);
  iVar17 = 0;
  iVar3 = 5;
  iVar16 = 0;
  while (pFVar10 = local_208, iVar15 = iVar3 + -1, iVar3 != 0) {
    __isoc99_fscanf(local_208,"%14c",buf);
    buf[0xe] = '\0';
    __isoc99_sscanf(buf,"%d",&tmp);
    if (iVar3 == 2) {
      iVar17 = tmp;
    }
    iVar2 = tmp;
    if (tmp == 0) {
      iVar2 = iVar16;
    }
    bVar19 = iVar3 == 1;
    iVar3 = iVar15;
    if (bVar19) {
      iVar16 = iVar2;
    }
  }
  cDumpLine((FILE *)local_208);
  __isoc99_fscanf(pFVar10,"%3c",type);
  __isoc99_fscanf(pFVar10,"%11c",buf);
  type[3] = '\0';
  __isoc99_fscanf(pFVar10,"%14c",buf);
  iVar3 = atoi(buf);
  *nrow = iVar3;
  __isoc99_fscanf(pFVar10,"%14c",buf);
  iVar3 = atoi(buf);
  *ncol = iVar3;
  __isoc99_fscanf(pFVar10,"%14c",buf);
  iVar3 = atoi(buf);
  *nonz = iVar3;
  __isoc99_fscanf(pFVar10,"%14c",buf);
  tmp = atoi(buf);
  if (tmp != 0) {
    puts("This is not an assembled matrix!");
  }
  if (*nrow != *ncol) {
    puts("Matrix is not square.");
  }
  pFVar10 = local_208;
  cDumpLine((FILE *)local_208);
  callocateA(*ncol,*nonz,local_220,local_218,colptr);
  __isoc99_fscanf(pFVar10,"%16c",buf);
  cParseIntFormat(buf,&colnum,&colsize);
  __isoc99_fscanf(pFVar10,"%16c",buf);
  cParseIntFormat(buf,&rownum,&rowsize);
  __isoc99_fscanf(pFVar10,"%20c",buf);
  cParseFloatFormat(buf,&valnum,&valsize);
  __isoc99_fscanf(pFVar10,"%20c",buf);
  cDumpLine((FILE *)pFVar10);
  if (iVar16 != 0) {
    cDumpLine((FILE *)pFVar10);
  }
  ReadVector((FILE *)pFVar10,*ncol + 1,*colptr,colnum,colsize);
  ReadVector((FILE *)pFVar10,*nonz,*local_218,rownum,rowsize);
  if (iVar17 != 0) {
    cReadValues((FILE *)pFVar10,*nonz,*local_220,valnum,valsize);
  }
  if ((type[1] & 0xdfU) == 0x53) {
    uVar18 = *ncol;
    addr = *local_218;
    addr_00 = *colptr;
    psVar9 = *local_220;
    iVar17 = uVar18 + 1;
    addr_01 = intMalloc(iVar17);
    local_210 = psVar9;
    if (addr_01 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for marker[]",0xd5,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/creadhb.c");
      superlu_abort_and_exit(msg);
    }
    local_200 = intMalloc(iVar17);
    if (local_200 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC t_colptr[]",0xd7,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/creadhb.c");
      superlu_abort_and_exit(msg);
    }
    addr_02 = intMalloc(*nonz);
    if (addr_02 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_rowind[]",0xd9,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/creadhb.c");
      superlu_abort_and_exit(msg);
    }
    local_1f0 = superlu_malloc((long)*nonz << 3);
    if (local_1f0 == (void *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_val[]",0xdb,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/creadhb.c");
      superlu_abort_and_exit(msg);
    }
    uVar4 = 0;
    uVar13 = 0;
    if (0 < (int)uVar18) {
      uVar13 = (ulong)uVar18;
    }
    for (; uVar13 != uVar4; uVar4 = uVar4 + 1) {
      addr_01[uVar4] = 0;
    }
    uVar4 = 0;
    while (uVar4 != uVar13) {
      piVar1 = addr_00 + uVar4;
      uVar4 = uVar4 + 1;
      for (lVar8 = (long)*piVar1; lVar8 < addr_00[uVar4]; lVar8 = lVar8 + 1) {
        addr_01[addr[lVar8]] = addr_01[addr[lVar8]] + 1;
      }
    }
    *local_200 = 0;
    for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
      local_200[uVar4 + 1] = addr_01[uVar4] + local_200[uVar4];
      addr_01[uVar4] = local_200[uVar4];
    }
    uVar4 = 0;
    while (uVar5 = uVar4, uVar5 != uVar13) {
      for (lVar8 = (long)addr_00[uVar5]; uVar4 = uVar5 + 1, lVar8 < addr_00[uVar5 + 1];
          lVar8 = lVar8 + 1) {
        iVar3 = addr[lVar8];
        addr_02[addr_01[iVar3]] = (int_t)uVar5;
        *(singlecomplex *)((long)local_1f0 + (long)addr_01[iVar3] * 8) = psVar9[lVar8];
        addr_01[iVar3] = addr_01[iVar3] + 1;
      }
    }
    lVar8 = (long)*nonz * 2 - (long)(int)uVar18;
    local_1f8 = intMalloc(iVar17);
    if (local_1f8 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC a_colptr[]",0xf4,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/creadhb.c");
      superlu_abort_and_exit(msg);
    }
    piVar6 = intMalloc((int_t)lVar8);
    if (piVar6 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_rowind[]",0xf6,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/creadhb.c");
      superlu_abort_and_exit(msg);
    }
    psVar7 = (singlecomplex *)superlu_malloc(lVar8 * 8);
    if (psVar7 == (singlecomplex *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_val[]",0xf8,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/creadhb.c");
      superlu_abort_and_exit(msg);
    }
    *local_1f8 = 0;
    uVar18 = 0;
    piVar14 = local_200;
    uVar4 = 0;
    while (uVar4 != uVar13) {
      uVar5 = uVar4 + 1;
      for (lVar11 = (long)piVar14[uVar4]; lVar11 < piVar14[uVar5]; lVar11 = lVar11 + 1) {
        if (uVar4 != (uint)addr_02[lVar11]) {
          piVar6[(int)uVar18] = addr_02[lVar11];
          psVar9 = psVar7 + (int)uVar18;
          psVar7[(int)uVar18] = *(singlecomplex *)((long)local_1f0 + lVar11 * 8);
          dVar20 = c_abs1(psVar9);
          if (dVar20 < 4.047e-300) {
            printf("%5d: %e\t%e\n",(double)psVar9->r,(double)psVar9->i,(ulong)uVar18);
          }
          uVar18 = uVar18 + 1;
          piVar14 = local_200;
        }
      }
      lVar11 = (long)addr_00[uVar4];
      for (lVar12 = 0; lVar11 + lVar12 < (long)addr_00[uVar5]; lVar12 = lVar12 + 1) {
        piVar6[(int)uVar18 + lVar12] = addr[lVar11 + lVar12];
        psVar7[(int)uVar18 + lVar12] = local_210[lVar11 + lVar12];
      }
      uVar18 = uVar18 + (int)lVar12;
      local_1f8[uVar5] = uVar18;
      psVar9 = local_210;
      uVar4 = uVar5;
    }
    printf("FormFullA: new_nnz = %lld\n",lVar8);
    superlu_free(psVar9);
    superlu_free(addr);
    superlu_free(addr_00);
    superlu_free(addr_01);
    superlu_free(local_1f0);
    superlu_free(addr_02);
    superlu_free(local_200);
    *local_220 = psVar7;
    *local_218 = piVar6;
    *colptr = local_1f8;
    *nonz = (int_t)lVar8;
    pFVar10 = local_208;
  }
  fclose(pFVar10);
  return;
}

Assistant:

void
creadhb(FILE *fp, int *nrow, int *ncol, int_t *nonz,
	singlecomplex **nzval, int_t **rowind, int_t **colptr)
{

    register int i, numer_lines = 0, rhscrd = 0;
    int tmp, colnum, colsize, rownum, rowsize, valnum, valsize;
    char buf[100], type[4];
    int sym;

    /* Line 1 */
    fgets(buf, 100, fp);
    fputs(buf, stdout);

    /* Line 2 */
    for (i=0; i<5; i++) {
	fscanf(fp, "%14c", buf); buf[14] = 0;
	sscanf(buf, "%d", &tmp);
	if (i == 3) numer_lines = tmp;
	if (i == 4 && tmp) rhscrd = tmp;
    }
    cDumpLine(fp);

    /* Line 3 */
    fscanf(fp, "%3c", type);
    fscanf(fp, "%11c", buf); /* pad */
    type[3] = 0;
#if ( DEBUGlevel>=1 )
    printf("Matrix type %s\n", type);
#endif
    
    fscanf(fp, "%14c", buf); *nrow = atoi(buf);
    fscanf(fp, "%14c", buf); *ncol = atoi(buf);
    fscanf(fp, "%14c", buf); *nonz = atoi(buf);
    fscanf(fp, "%14c", buf); tmp = atoi(buf);
    
    if (tmp != 0)
	  printf("This is not an assembled matrix!\n");
    if (*nrow != *ncol)
	printf("Matrix is not square.\n");
    cDumpLine(fp);

    /* Allocate storage for the three arrays ( nzval, rowind, colptr ) */
    callocateA(*ncol, *nonz, nzval, rowind, colptr);

    /* Line 4: format statement */
    fscanf(fp, "%16c", buf);
    cParseIntFormat(buf, &colnum, &colsize);
    fscanf(fp, "%16c", buf);
    cParseIntFormat(buf, &rownum, &rowsize);
    fscanf(fp, "%20c", buf);
    cParseFloatFormat(buf, &valnum, &valsize);
    fscanf(fp, "%20c", buf);
    cDumpLine(fp);

    /* Line 5: right-hand side */    
    if ( rhscrd ) cDumpLine(fp); /* skip RHSFMT */
    
#ifdef DEBUG
    printf("%d rows, %lld nonzeros\n", *nrow, (long long) *nonz);
    printf("colnum %d, colsize %d\n", colnum, colsize);
    printf("rownum %d, rowsize %d\n", rownum, rowsize);
    printf("valnum %d, valsize %d\n", valnum, valsize);
#endif
    
    ReadVector(fp, *ncol+1, *colptr, colnum, colsize);
    ReadVector(fp, *nonz, *rowind, rownum, rowsize);
    if ( numer_lines ) {
        cReadValues(fp, *nonz, *nzval, valnum, valsize);
    }
    
    sym = (type[1] == 'S' || type[1] == 's');
    if ( sym ) {
	FormFullA(*ncol, nonz, nzval, rowind, colptr);
    }

    fclose(fp);
}